

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::IncreasePurchaseNumber(Handler *this)

{
  bool bVar1;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *in_RDI;
  ExtendResult *res;
  iterator __end1;
  iterator __begin1;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *__range1;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *extendResult;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
  local_20;
  reference local_18;
  reference local_10;
  
  local_18 = std::vector<Result,_std::allocator<Result>_>::operator[]
                       ((vector<Result,_std::allocator<Result>_> *)
                        &in_RDI[0x446b].
                         super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (ulong)*(ushort *)
                                &in_RDI[0x446b].
                                 super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  local_10 = local_18;
  local_20._M_current =
       (ExtendResult *)std::vector<ExtendResult,_std::allocator<ExtendResult>_>::begin(in_RDI);
  std::vector<ExtendResult,_std::allocator<ExtendResult>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
         ::operator*(&local_20);
    *(uint16_t *)
     &in_RDI[0x446b].super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl.
      super__Vector_impl_data._M_finish =
         *(short *)&in_RDI[0x446b].super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
         in_stack_ffffffffffffffd0->purchaseNum;
    __gnu_cxx::
    __normal_iterator<ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>::
    operator++(&local_20);
  }
  return;
}

Assistant:

void Handler::IncreasePurchaseNumber() {
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    for (ExtendResult &res : extendResult) {
        totalPurchasedServerNum += res.purchaseNum;
    }
}